

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O2

void make_transform_image
               (png_store *ps,png_byte colour_type,png_byte bit_depth,uint palette_number,
               int interlace_type,png_const_charp name)

{
  uint uVar1;
  png_byte colour_type_00;
  jmp_buf *pa_Var2;
  png_infop ppVar3;
  png_uint_16 pVar4;
  ushort uVar5;
  png_uint_16 pVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  png_store *ps_00;
  undefined6 extraout_var;
  size_t sVar10;
  size_t sVar11;
  undefined7 in_register_00000011;
  char *name_00;
  char *pcVar12;
  undefined4 in_register_00000084;
  png_uint_32 y;
  png_uint_32 y_00;
  undefined1 auVar13 [16];
  png_infop pi;
  uint local_54c;
  uint local_548;
  int local_544;
  int local_540;
  png_uint_32 local_53c;
  jmp_buf *local_538;
  undefined4 local_530 [2];
  char *local_528;
  char *local_520;
  size_t local_518;
  undefined1 local_510 [16];
  char local_500 [8];
  char copy [64];
  jmp_buf exception__env;
  
  pa_Var2 = pm.this.exception_context.penv;
  colour_type_00 = (png_byte)ps;
  pm.this.exception_context.penv = &exception__env;
  iVar7 = _setjmp((__jmp_buf_tag *)pm.this.exception_context.penv);
  if (iVar7 != 0) {
    pm.this.exception_context.caught = 1;
    pm.this.exception_context.penv = pa_Var2;
    store_write_reset(pm.this.exception_context.v.etmp);
    return;
  }
  local_544 = (int)CONCAT71(in_register_00000011,bit_depth);
  local_538 = pa_Var2;
  local_548 = palette_number;
  ps_00 = (png_store *)
          set_store_for_write((png_store *)&pi,
                              (png_infopp)CONCAT44(in_register_00000084,interlace_type),name_00);
  if (ps_00 != (png_store *)0x0) {
    uVar9 = (uint)colour_type;
    local_53c = transform_height((png_const_structp)ps_00,colour_type_00,colour_type);
    local_54c = uVar9;
    png_set_IHDR(ps_00,pi,0x80,local_53c,colour_type,(ulong)ps & 0xff,local_548,0,0);
    local_530[0]._0_1_ = '\0';
    local_530[0]._1_1_ = '\0';
    local_530[0]._2_1_ = '\0';
    local_530[0]._3_1_ = '\0';
    local_528 = make_transform_image::key;
    local_518 = safecat(copy,0x40,0,pm.this.wname);
    local_510 = (undefined1  [16])0x0;
    local_500[0] = '\0';
    local_500[1] = '\0';
    local_500[2] = '\0';
    local_500[3] = '\0';
    local_500[4] = '\0';
    local_500[5] = '\0';
    local_500[6] = '\0';
    local_500[7] = '\0';
    local_520 = copy;
    png_set_text(ps_00,pi,local_530,1);
    ppVar3 = pi;
    if (colour_type_00 == '\x03') {
      init_standard_palette
                (ps_00,(png_structp)pi,(png_infop)(ulong)(uint)(1 << (colour_type & 0x1f)),1,uVar9);
    }
    else if (local_544 != 0) {
      randomize_bytes(copy,10);
      if (((ulong)ps & 2) == 0) {
        pVar4 = random_u16();
        uVar5 = pVar4 & ~(ushort)(-1 << (colour_type & 0x1f));
        copy[8] = (char)uVar5;
        copy[9] = (char)(uVar5 >> 8);
      }
      else {
        pVar4 = random_u16();
        if (colour_type == '\b') {
          pVar6 = random_u16();
          copy._0_4_ = CONCAT22(pVar4,copy._0_2_) & 0xffffff;
          copy._4_4_ = CONCAT22(pVar6 ^ pVar4,pVar6) & 0xff00ff;
        }
        else {
          copy[2] = (char)pVar4;
          copy[3] = (char)(pVar4 >> 8);
          auVar13 = ZEXT416((uint)CONCAT62(extraout_var,pVar4));
          auVar13 = pshuflw(auVar13,auVar13,0);
          copy._4_2_ = auVar13._0_2_ * 0x101;
          copy._6_2_ = auVar13._2_2_ * 0x1111;
        }
      }
      png_set_tRNS(ps_00,ppVar3,0,0,copy);
    }
    png_write_info(ps_00,pi);
    sVar10 = png_get_rowbytes(ps_00,pi);
    sVar11 = transform_rowsize((png_const_structp)ps_00,colour_type_00,(png_byte)local_54c);
    if (sVar10 == sVar11) {
      iVar7 = png_set_interlace_handling(ps_00);
      iVar8 = npasses_from_interlace_type((png_const_structp)ps_00,local_548);
      local_540 = iVar7;
      if (iVar7 == iVar8) {
        for (iVar7 = 0; iVar7 != local_540; iVar7 = iVar7 + 1) {
          for (y_00 = 0; local_53c != y_00; y_00 = y_00 + 1) {
            transform_row((png_const_structp)ps_00,(png_byte *)copy,colour_type_00,
                          (png_byte)local_54c,y_00);
            uVar9 = random_mod(0x100);
            uVar9 = uVar9 & 0xf8;
            if (uVar9 != 0) {
              uVar1 = uVar9 | 0x20;
              if (0x1f < uVar9) {
                uVar1 = uVar9;
              }
              if (y_00 != 0 || iVar7 != 0) {
                uVar1 = uVar9;
              }
              png_set_filter(ps_00,0,uVar1);
            }
            png_write_row(ps_00,copy);
          }
        }
        copy[0] = '\0';
        copy[1] = '\0';
        copy[2] = '\0';
        copy[3] = '\0';
        copy._8_8_ = make_transform_image::key_1;
        copy._16_8_ = make_transform_image::comment;
        copy[0x18] = '\x03';
        copy[0x19] = '\0';
        copy[0x1a] = '\0';
        copy[0x1b] = '\0';
        copy[0x1c] = '\0';
        copy[0x1d] = '\0';
        copy[0x1e] = '\0';
        copy[0x1f] = '\0';
        copy[0x20] = '\0';
        copy[0x21] = '\0';
        copy[0x22] = '\0';
        copy[0x23] = '\0';
        copy[0x24] = '\0';
        copy[0x25] = '\0';
        copy[0x26] = '\0';
        copy[0x27] = '\0';
        copy[0x28] = '\0';
        copy[0x29] = '\0';
        copy[0x2a] = '\0';
        copy[0x2b] = '\0';
        copy[0x2c] = '\0';
        copy[0x2d] = '\0';
        copy[0x2e] = '\0';
        copy[0x2f] = '\0';
        copy[0x30] = '\0';
        copy[0x31] = '\0';
        copy[0x32] = '\0';
        copy[0x33] = '\0';
        copy[0x34] = '\0';
        copy[0x35] = '\0';
        copy[0x36] = '\0';
        copy[0x37] = '\0';
        png_set_text(ps_00,pi,copy,1);
        png_write_end(ps_00);
        store_storefile((png_store *)
                        (ulong)(local_548 * 0x2000 +
                               local_544 * 0x100 + (int)((ulong)ps & 0xff) + local_54c * 8),
                        (png_uint_32)pi);
        store_write_reset(&pm.this);
        pm.this.exception_context.penv = local_538;
        pm.this.exception_context.caught = 0;
        return;
      }
      pcVar12 = "write: png_set_interlace_handling failed";
    }
    else {
      pcVar12 = "transform row size incorrect";
    }
    png_error(ps_00,pcVar12);
  }
  pm.this.exception_context.v.etmp = &pm.this;
  longjmp((__jmp_buf_tag *)pm.this.exception_context.penv,1);
}

Assistant:

static void
make_transform_image(png_store* const ps, png_byte const colour_type,
    png_byte const bit_depth, unsigned int palette_number,
    int interlace_type, png_const_charp name)
{
   context(ps, fault);

   check_interlace_type(interlace_type);

   Try
   {
      png_infop pi;
      png_structp pp = set_store_for_write(ps, &pi, name);
      png_uint_32 h, w;

      /* In the event of a problem return control to the Catch statement below
       * to do the clean up - it is not possible to 'return' directly from a Try
       * block.
       */
      if (pp == NULL)
         Throw ps;

      w = transform_width(pp, colour_type, bit_depth);
      h = transform_height(pp, colour_type, bit_depth);

      png_set_IHDR(pp, pi, w, h, bit_depth, colour_type, interlace_type,
         PNG_COMPRESSION_TYPE_BASE, PNG_FILTER_TYPE_BASE);

#ifdef PNG_TEXT_SUPPORTED
#  if defined(PNG_READ_zTXt_SUPPORTED) && defined(PNG_WRITE_zTXt_SUPPORTED)
#     define TEXT_COMPRESSION PNG_TEXT_COMPRESSION_zTXt
#  else
#     define TEXT_COMPRESSION PNG_TEXT_COMPRESSION_NONE
#  endif
      {
         static char key[] = "image name"; /* must be writeable */
         size_t pos;
         png_text text;
         char copy[FILE_NAME_SIZE];

         /* Use a compressed text string to test the correct interaction of text
          * compression and IDAT compression.
          */
         text.compression = TEXT_COMPRESSION;
         text.key = key;
         /* Yuck: the text must be writable! */
         pos = safecat(copy, sizeof copy, 0, ps->wname);
         text.text = copy;
         text.text_length = pos;
         text.itxt_length = 0;
         text.lang = 0;
         text.lang_key = 0;

         png_set_text(pp, pi, &text, 1);
      }
#endif

      if (colour_type == 3) /* palette */
         init_standard_palette(ps, pp, pi, 1U << bit_depth, 1/*do tRNS*/);

#     ifdef PNG_WRITE_tRNS_SUPPORTED
         else if (palette_number)
            set_random_tRNS(pp, pi, colour_type, bit_depth);
#     endif

      png_write_info(pp, pi);

      if (png_get_rowbytes(pp, pi) !=
          transform_rowsize(pp, colour_type, bit_depth))
         png_error(pp, "transform row size incorrect");

      else
      {
         /* Somewhat confusingly this must be called *after* png_write_info
          * because if it is called before, the information in *pp has not been
          * updated to reflect the interlaced image.
          */
         int npasses = set_write_interlace_handling(pp, interlace_type);
         int pass;

         if (npasses != npasses_from_interlace_type(pp, interlace_type))
            png_error(pp, "write: png_set_interlace_handling failed");

         for (pass=0; pass<npasses; ++pass)
         {
            png_uint_32 y;

            /* do_own_interlace is a pre-defined boolean (a #define) which is
             * set if we have to work out the interlaced rows here.
             */
            for (y=0; y<h; ++y)
            {
               png_byte buffer[TRANSFORM_ROWMAX];

               transform_row(pp, buffer, colour_type, bit_depth, y);

#              if do_own_interlace
                  /* If do_own_interlace *and* the image is interlaced we need a
                   * reduced interlace row; this may be reduced to empty.
                   */
                  if (interlace_type == PNG_INTERLACE_ADAM7)
                  {
                     /* The row must not be written if it doesn't exist, notice
                      * that there are two conditions here, either the row isn't
                      * ever in the pass or the row would be but isn't wide
                      * enough to contribute any pixels.  In fact the wPass test
                      * can be used to skip the whole y loop in this case.
                      */
                     if (PNG_ROW_IN_INTERLACE_PASS(y, pass) &&
                         PNG_PASS_COLS(w, pass) > 0)
                        interlace_row(buffer, buffer,
                              bit_size(pp, colour_type, bit_depth), w, pass,
                              0/*data always bigendian*/);
                     else
                        continue;
                  }
#              endif /* do_own_interlace */

               choose_random_filter(pp, pass == 0 && y == 0);
               png_write_row(pp, buffer);
            }
         }
      }

#ifdef PNG_TEXT_SUPPORTED
      {
         static char key[] = "end marker";
         static char comment[] = "end";
         png_text text;

         /* Use a compressed text string to test the correct interaction of text
          * compression and IDAT compression.
          */
         text.compression = TEXT_COMPRESSION;
         text.key = key;
         text.text = comment;
         text.text_length = (sizeof comment)-1;
         text.itxt_length = 0;
         text.lang = 0;
         text.lang_key = 0;

         png_set_text(pp, pi, &text, 1);
      }
#endif

      png_write_end(pp, pi);

      /* And store this under the appropriate id, then clean up. */
      store_storefile(ps, FILEID(colour_type, bit_depth, palette_number,
         interlace_type, 0, 0, 0));

      store_write_reset(ps);
   }

   Catch(fault)
   {
      /* Use the png_store returned by the exception. This may help the compiler
       * because 'ps' is not used in this branch of the setjmp.  Note that fault
       * and ps will always be the same value.
       */
      store_write_reset(fault);
   }
}